

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeLhs(SPxLPBase<double> *this,VectorBase<double> *newLhs,bool scale)

{
  pointer pdVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  double extraout_XMM0_Qa;
  
  if ((int)CONCAT71(in_register_00000011,scale) != 0) {
    if (0 < (int)((ulong)((long)(this->super_LPRowSetBase<double>).left.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->super_LPRowSetBase<double>).left.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3)) {
      uVar2 = 0;
      do {
        (*this->lp_scaler->_vptr_SPxScaler[0x2d])
                  ((newLhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2],this->lp_scaler,this,uVar2 & 0xffffffff);
        pdVar1 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar1[uVar2] = extraout_XMM0_Qa;
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 <
               (long)(int)((ulong)((long)(this->super_LPRowSetBase<double>).left.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar1) >> 3));
    }
    return;
  }
  VectorBase<double>::operator=(&(this->super_LPRowSetBase<double>).left,newLhs);
  return;
}

Assistant:

virtual void changeLhs(const VectorBase<R>& newLhs, bool scale = false)
   {
      assert(lhs().dim() == newLhs.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < lhs().dim(); i++)
            LPRowSetBase<R>::lhs_w(i) = lp_scaler->scaleLhs(*this, i, newLhs[i]);
      }
      else
         LPRowSetBase<R>::lhs_w() = newLhs;

      assert(isConsistent());
   }